

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPMINRES.cpp
# Opt level: O1

double __thiscall
chrono::ChSolverPMINRES::Solve_SupportingStiffness(ChSolverPMINRES *this,ChSystemDescriptor *sysd)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double *pdVar13;
  Index IVar14;
  double *pdVar15;
  Index IVar16;
  double *pdVar17;
  Index IVar18;
  int iVar19;
  int iVar20;
  Index dstRows;
  ChLog *pCVar21;
  ChStreamOutAscii *pCVar22;
  Index size_6;
  char *pcVar23;
  Index index;
  ulong uVar24;
  Index dstRows_3;
  Index dstRows_1;
  uint iternum;
  SrcEvaluatorType srcEvaluator;
  Index size;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar32 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 in_ZMM3 [64];
  ChVectorDynamic<> mz;
  ChVectorDynamic<> mr;
  ChVectorDynamic<> mp;
  ChVectorDynamic<> mZp;
  ChVectorDynamic<> mZMr;
  ChVectorDynamic<> mMZp;
  ChVectorDynamic<> mtmp;
  ChVectorDynamic<> mx;
  ChVectorDynamic<> mDi;
  ChVectorDynamic<> mZMr_old;
  ChVectorDynamic<> mz_old;
  ChVectorDynamic<> md;
  scalar_max_op<double,_double,_0> local_199;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_198;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_188;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_178;
  double local_168;
  undefined8 uStack_160;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_158;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_148;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_138;
  double local_128;
  undefined8 uStack_120;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_118;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_108;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_f0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_d8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_c8;
  Scalar local_b8;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_b0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_98;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_88;
  undefined1 local_78 [16];
  Scalar local_60;
  double local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  auVar32 = in_ZMM3._0_16_;
  (this->super_ChIterativeSolverVI).m_iterations = 0;
  iVar19 = (*sysd->_vptr_ChSystemDescriptor[7])(sysd);
  iVar20 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
    pCVar21 = GetLog();
    pCVar22 = ChStreamOutAscii::operator<<
                        (&pCVar21->super_ChStreamOutAscii,
                         "\n-----Projected MINRES -supporting stiffness-, n.vars nx=");
    pCVar22 = ChStreamOutAscii::operator<<(pCVar22,iVar20 + iVar19);
    pCVar22 = ChStreamOutAscii::operator<<(pCVar22,"  max.iters=");
    pCVar22 = ChStreamOutAscii::operator<<
                        (pCVar22,(this->super_ChIterativeSolverVI).super_ChIterativeSolver.
                                 m_max_iterations);
    ChStreamOutAscii::operator<<(pCVar22,"\n");
  }
  local_108.m_storage.m_data = (double *)0x0;
  local_108.m_storage.m_rows = 0;
  lVar25 = (long)(iVar20 + iVar19);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_108,lVar25);
  local_88.m_storage.m_data = (double *)0x0;
  local_88.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_88,lVar25);
  local_178.m_storage.m_data = (double *)0x0;
  local_178.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_178,lVar25);
  local_188.m_storage.m_data = (double *)0x0;
  local_188.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_188,lVar25);
  local_198.m_storage.m_data = (double *)0x0;
  local_198.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_198,lVar25);
  local_98.m_storage.m_data = (double *)0x0;
  local_98.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,lVar25);
  local_158.m_storage.m_data = (double *)0x0;
  local_158.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_158,lVar25);
  local_138.m_storage.m_data = (double *)0x0;
  local_138.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_138,lVar25);
  local_148.m_storage.m_data = (double *)0x0;
  local_148.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_148,lVar25);
  local_c8.m_storage.m_data = (double *)0x0;
  local_c8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_c8,lVar25);
  local_118.m_storage.m_data = (double *)0x0;
  local_118.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_118,lVar25);
  local_d8.m_storage.m_data = (double *)0x0;
  local_d8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_d8,lVar25);
  (*sysd->_vptr_ChSystemDescriptor[0xf])(sysd);
  if (0 < local_d8.m_storage.m_rows) {
    uVar24 = 0;
    auVar27._8_8_ = 0x7fffffffffffffff;
    auVar27._0_8_ = 0x7fffffffffffffff;
    do {
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_d8.m_storage.m_data[uVar24];
      auVar26 = vandpd_avx(auVar26,auVar27);
      auVar32._0_8_ = 1.0 / local_d8.m_storage.m_data[uVar24];
      auVar32._8_8_ = 0;
      uVar7 = vcmpsd_avx512f(auVar26,ZEXT816(0x3e112e0be826d695),0xe);
      bVar8 = (bool)((byte)uVar7 & 1);
      local_d8.m_storage.m_data[uVar24] =
           (double)((ulong)bVar8 * (long)auVar32._0_8_ + (ulong)!bVar8 * 0x3ff0000000000000);
      uVar24 = uVar24 + 1;
    } while (local_d8.m_storage.m_rows != uVar24);
  }
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
    if (local_108.m_storage.m_rows < 0) {
      pcVar23 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
LAB_007d70fe:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar23);
    }
    if (local_108.m_storage.m_rows != 0) {
      memset(local_108.m_storage.m_data,0,local_108.m_storage.m_rows << 3);
    }
  }
  else {
    (*sysd->_vptr_ChSystemDescriptor[0x14])(sysd,&local_108,1);
  }
  (*sysd->_vptr_ChSystemDescriptor[0xe])(sysd,&local_88);
  local_168 = (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance;
  local_128 = this->rel_tolerance;
  if (local_88.m_storage.m_rows == 0) {
    local_b8 = 0.0;
  }
  else {
    local_f0.m_lhs = (LhsNested)&local_88;
    if (local_88.m_storage.m_rows < 1) {
      pcVar23 = 
      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
      ;
      goto LAB_007d7185;
    }
    local_b0.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_88.m_storage.m_data;
    local_b8 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
               ::
               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&local_b0,&local_199,
                          (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           *)&local_f0);
  }
  (*sysd->_vptr_ChSystemDescriptor[0x19])(sysd,&local_108);
  (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&local_188,&local_108);
  IVar16 = local_d8.m_storage.m_rows;
  pdVar15 = local_d8.m_storage.m_data;
  IVar14 = local_188.m_storage.m_rows;
  pdVar13 = local_188.m_storage.m_data;
  if (local_88.m_storage.m_rows != local_188.m_storage.m_rows) {
LAB_007d713c:
    pcVar23 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
    ;
LAB_007d7230:
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar23);
  }
  uVar24 = local_188.m_storage.m_rows + 7;
  if (-1 < local_188.m_storage.m_rows) {
    uVar24 = local_188.m_storage.m_rows;
  }
  uVar24 = uVar24 & 0xfffffffffffffff8;
  if (7 < local_188.m_storage.m_rows) {
    lVar25 = 0;
    do {
      auVar28 = vsubpd_avx512f(*(undefined1 (*) [64])(local_88.m_storage.m_data + lVar25),
                               *(undefined1 (*) [64])(local_188.m_storage.m_data + lVar25));
      *(undefined1 (*) [64])(local_188.m_storage.m_data + lVar25) = auVar28;
      lVar25 = lVar25 + 8;
    } while (lVar25 < (long)uVar24);
  }
  if ((long)uVar24 < local_188.m_storage.m_rows) {
    do {
      local_188.m_storage.m_data[uVar24] =
           local_88.m_storage.m_data[uVar24] - local_188.m_storage.m_data[uVar24];
      uVar24 = uVar24 + 1;
    } while (local_188.m_storage.m_rows != uVar24);
  }
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond == true) {
    if (local_188.m_storage.m_rows != local_d8.m_storage.m_rows) {
LAB_007d721b:
      pcVar23 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>]"
      ;
      goto LAB_007d7230;
    }
    if (local_178.m_storage.m_rows != local_d8.m_storage.m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&local_178,local_d8.m_storage.m_rows,1);
    }
    if (local_178.m_storage.m_rows != IVar16) {
LAB_007d71f9:
      pcVar23 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
      ;
      goto LAB_007d720e;
    }
    uVar24 = local_178.m_storage.m_rows + 7;
    if (-1 < local_178.m_storage.m_rows) {
      uVar24 = local_178.m_storage.m_rows;
    }
    uVar24 = uVar24 & 0xfffffffffffffff8;
    if (7 < local_178.m_storage.m_rows) {
      lVar25 = 0;
      do {
        auVar28 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar13 + lVar25),
                                 *(undefined1 (*) [64])(pdVar15 + lVar25));
        *(undefined1 (*) [64])(local_178.m_storage.m_data + lVar25) = auVar28;
        lVar25 = lVar25 + 8;
      } while (lVar25 < (long)uVar24);
    }
    if ((long)uVar24 < local_178.m_storage.m_rows) {
      do {
        local_178.m_storage.m_data[uVar24] = pdVar13[uVar24] * pdVar15[uVar24];
        uVar24 = uVar24 + 1;
      } while (local_178.m_storage.m_rows != uVar24);
    }
LAB_007d607f:
    IVar14 = local_178.m_storage.m_rows;
    pdVar13 = local_178.m_storage.m_data;
    if (local_198.m_storage.m_rows != local_178.m_storage.m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&local_198,local_178.m_storage.m_rows,1);
    }
    if (local_198.m_storage.m_rows == IVar14) {
      uVar24 = local_198.m_storage.m_rows + 7;
      if (-1 < local_198.m_storage.m_rows) {
        uVar24 = local_198.m_storage.m_rows;
      }
      uVar24 = uVar24 & 0xfffffffffffffff8;
      if (7 < local_198.m_storage.m_rows) {
        lVar25 = 0;
        do {
          *(undefined1 (*) [64])(local_198.m_storage.m_data + lVar25) =
               *(undefined1 (*) [64])(pdVar13 + lVar25);
          lVar25 = lVar25 + 8;
        } while (lVar25 < (long)uVar24);
      }
      if ((long)uVar24 < local_198.m_storage.m_rows) {
        do {
          local_198.m_storage.m_data[uVar24] = pdVar13[uVar24];
          uVar24 = uVar24 + 1;
        } while (local_198.m_storage.m_rows != uVar24);
      }
      auVar28 = ZEXT1664(auVar32);
      (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&local_148,&local_198);
      (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&local_158,&local_178);
      if (0 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_168;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = local_b8 * local_128;
        auVar32 = vmaxsd_avx(auVar31,auVar2);
        local_b8 = auVar32._0_8_;
        iternum = 0;
        local_48 = 0x7fffffffffffffff;
        uStack_40 = 0x7fffffffffffffff;
        do {
          IVar16 = local_d8.m_storage.m_rows;
          pdVar15 = local_d8.m_storage.m_data;
          IVar14 = local_158.m_storage.m_rows;
          pdVar13 = local_158.m_storage.m_data;
          auVar32 = auVar28._0_16_;
          if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond == true) {
            if (local_158.m_storage.m_rows != local_d8.m_storage.m_rows) goto LAB_007d721b;
            if (local_138.m_storage.m_rows != local_d8.m_storage.m_rows) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_138,local_d8.m_storage.m_rows,1);
            }
            if (local_138.m_storage.m_rows != IVar16) goto LAB_007d71f9;
            uVar24 = local_138.m_storage.m_rows + 7;
            if (-1 < local_138.m_storage.m_rows) {
              uVar24 = local_138.m_storage.m_rows;
            }
            uVar24 = uVar24 & 0xfffffffffffffff8;
            if (7 < local_138.m_storage.m_rows) {
              lVar25 = 0;
              do {
                auVar28 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar13 + lVar25),
                                         *(undefined1 (*) [64])(pdVar15 + lVar25));
                *(undefined1 (*) [64])(local_138.m_storage.m_data + lVar25) = auVar28;
                lVar25 = lVar25 + 8;
              } while (lVar25 < (long)uVar24);
            }
            if ((long)uVar24 < local_138.m_storage.m_rows) {
              do {
                local_138.m_storage.m_data[uVar24] = pdVar13[uVar24] * pdVar15[uVar24];
                uVar24 = uVar24 + 1;
              } while (local_138.m_storage.m_rows != uVar24);
            }
          }
          else {
            if (local_138.m_storage.m_rows != local_158.m_storage.m_rows) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_138,local_158.m_storage.m_rows,1);
            }
            if (local_138.m_storage.m_rows != IVar14) goto LAB_007d710b;
            uVar24 = local_138.m_storage.m_rows + 7;
            if (-1 < local_138.m_storage.m_rows) {
              uVar24 = local_138.m_storage.m_rows;
            }
            uVar24 = uVar24 & 0xfffffffffffffff8;
            if (7 < local_138.m_storage.m_rows) {
              lVar25 = 0;
              do {
                *(undefined1 (*) [64])(local_138.m_storage.m_data + lVar25) =
                     *(undefined1 (*) [64])(pdVar13 + lVar25);
                lVar25 = lVar25 + 8;
              } while (lVar25 < (long)uVar24);
            }
            if ((long)uVar24 < local_138.m_storage.m_rows) {
              do {
                local_138.m_storage.m_data[uVar24] = pdVar13[uVar24];
                uVar24 = uVar24 + 1;
              } while (local_138.m_storage.m_rows != uVar24);
            }
          }
          if (local_198.m_storage.m_rows != local_148.m_storage.m_rows) goto LAB_007d70c7;
          local_f0.m_lhs = (LhsNested)&local_198;
          local_f0.m_rhs = (RhsNested)&local_148;
          if (local_148.m_storage.m_rows != 0) {
            if (0 < local_148.m_storage.m_rows) {
              local_b0.
              super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              .
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
              data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                     (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_198.m_storage.m_data;
              local_b0.
              super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              .
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
              data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                     (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_148.m_storage.m_data;
              local_168 = Eigen::internal::
                          redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                          ::
                          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                    (&local_b0,(scalar_sum_op<double,_double> *)&local_199,&local_f0
                                    );
              uStack_160 = extraout_XMM0_Qb;
              goto LAB_007d631b;
            }
LAB_007d7125:
            pcVar23 = 
            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
            ;
            goto LAB_007d7185;
          }
          local_168 = 0.0;
          uStack_160 = 0;
LAB_007d631b:
          if (local_138.m_storage.m_rows != local_158.m_storage.m_rows) goto LAB_007d70c7;
          local_f0.m_lhs = (LhsNested)&local_138;
          local_f0.m_rhs = (RhsNested)&local_158;
          if (local_158.m_storage.m_rows == 0) {
            auVar27 = ZEXT816(0) << 0x40;
          }
          else {
            if (local_158.m_storage.m_rows < 1) goto LAB_007d7125;
            local_b0.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_138.m_storage.m_data;
            local_b0.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_158.m_storage.m_data;
            auVar28._0_8_ =
                 Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                 ::
                 run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                           (&local_b0,(scalar_sum_op<double,_double> *)&local_199,&local_f0);
            auVar28._8_56_ = extraout_var;
            auVar27 = auVar28._0_16_;
          }
          auVar9._8_8_ = 0x7fffffffffffffff;
          auVar9._0_8_ = 0x7fffffffffffffff;
          auVar26 = vandpd_avx512vl(auVar27,auVar9);
          if (1e-29 <= auVar26._0_8_) {
            local_128 = auVar27._0_8_;
          }
          else {
            local_128 = 1e-29;
            local_78 = auVar27;
            if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
              pCVar21 = GetLog();
              pCVar22 = ChStreamOutAscii::operator<<
                                  (&pCVar21->super_ChStreamOutAscii,
                                   "Rayleigh alpha denominator breakdown: ");
              pCVar22 = ChStreamOutAscii::operator<<(pCVar22,local_168);
              pCVar22 = ChStreamOutAscii::operator<<(pCVar22," / ");
              pCVar22 = ChStreamOutAscii::operator<<(pCVar22,(double)local_78._0_8_);
              pCVar22 = ChStreamOutAscii::operator<<(pCVar22,"=");
              pCVar22 = ChStreamOutAscii::operator<<(pCVar22,local_168 / (double)local_78._0_8_);
              pCVar22 = ChStreamOutAscii::operator<<(pCVar22,"  iter=");
              pCVar22 = ChStreamOutAscii::operator<<(pCVar22,iternum);
              ChStreamOutAscii::operator<<(pCVar22,"\n");
              local_128 = 1e-29;
            }
          }
          auVar34._8_8_ = uStack_160;
          auVar34._0_8_ = local_168;
          auVar10._8_8_ = 0x7fffffffffffffff;
          auVar10._0_8_ = 0x7fffffffffffffff;
          auVar27 = vandpd_avx512vl(auVar34,auVar10);
          dVar33 = local_128;
          if (auVar27._0_8_ < 1e-29) {
            auVar34 = ZEXT816(0x3ff0000000000000);
            dVar33 = 1.0;
            if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
              pCVar21 = GetLog();
              pCVar22 = ChStreamOutAscii::operator<<
                                  (&pCVar21->super_ChStreamOutAscii,
                                   "Rayleigh alpha numerator breakdown: ");
              pCVar22 = ChStreamOutAscii::operator<<(pCVar22,local_168);
              pCVar22 = ChStreamOutAscii::operator<<(pCVar22," / ");
              pCVar22 = ChStreamOutAscii::operator<<(pCVar22,local_128);
              pCVar22 = ChStreamOutAscii::operator<<(pCVar22,"=");
              pCVar22 = ChStreamOutAscii::operator<<(pCVar22,local_168 / local_128);
              pCVar22 = ChStreamOutAscii::operator<<(pCVar22,"  iter=");
              pCVar22 = ChStreamOutAscii::operator<<(pCVar22,iternum);
              ChStreamOutAscii::operator<<(pCVar22,"\n");
              auVar34 = ZEXT816(0x3ff0000000000000);
              dVar33 = 1.0;
            }
          }
          local_168 = auVar34._0_8_ / dVar33;
          uStack_160 = auVar34._8_8_;
          if ((local_168 < 0.0) &&
             ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true)) {
            pCVar21 = GetLog();
            pCVar22 = ChStreamOutAscii::operator<<
                                (&pCVar21->super_ChStreamOutAscii,"Rayleigh alpha < 0: ");
            pCVar22 = ChStreamOutAscii::operator<<(pCVar22,local_168);
            pCVar22 = ChStreamOutAscii::operator<<(pCVar22,"    iter=");
            pCVar22 = ChStreamOutAscii::operator<<(pCVar22,iternum);
            ChStreamOutAscii::operator<<(pCVar22,"\n");
          }
          IVar14 = local_178.m_storage.m_rows;
          pdVar13 = local_178.m_storage.m_data;
          if (local_178.m_storage.m_rows < 0) {
LAB_007d70e9:
            pcVar23 = 
            "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_007d70fe;
          }
          if (local_118.m_storage.m_rows != local_178.m_storage.m_rows) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_118,local_178.m_storage.m_rows,1);
          }
          if (local_118.m_storage.m_rows != IVar14) {
            pcVar23 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
            ;
            goto LAB_007d720e;
          }
          uVar24 = local_118.m_storage.m_rows + 7;
          if (-1 < local_118.m_storage.m_rows) {
            uVar24 = local_118.m_storage.m_rows;
          }
          uVar24 = uVar24 & 0xfffffffffffffff8;
          if (7 < local_118.m_storage.m_rows) {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_168;
            auVar28 = vbroadcastsd_avx512f(auVar3);
            lVar25 = 0;
            do {
              auVar29 = vmulpd_avx512f(auVar28,*(undefined1 (*) [64])(pdVar13 + lVar25));
              *(undefined1 (*) [64])(local_118.m_storage.m_data + lVar25) = auVar29;
              lVar25 = lVar25 + 8;
            } while (lVar25 < (long)uVar24);
          }
          if ((long)uVar24 < local_118.m_storage.m_rows) {
            do {
              local_118.m_storage.m_data[uVar24] = local_168 * pdVar13[uVar24];
              uVar24 = uVar24 + 1;
            } while (local_118.m_storage.m_rows != uVar24);
          }
          if (local_108.m_storage.m_rows != local_118.m_storage.m_rows) {
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                         );
          }
          uVar24 = local_108.m_storage.m_rows + 7;
          if (-1 < local_108.m_storage.m_rows) {
            uVar24 = local_108.m_storage.m_rows;
          }
          uVar24 = uVar24 & 0xfffffffffffffff8;
          if (7 < local_108.m_storage.m_rows) {
            lVar25 = 0;
            do {
              auVar28 = vaddpd_avx512f(*(undefined1 (*) [64])(local_118.m_storage.m_data + lVar25),
                                       *(undefined1 (*) [64])(local_108.m_storage.m_data + lVar25));
              *(undefined1 (*) [64])(local_108.m_storage.m_data + lVar25) = auVar28;
              lVar25 = lVar25 + 8;
            } while (lVar25 < (long)uVar24);
          }
          if ((long)uVar24 < local_108.m_storage.m_rows) {
            do {
              local_108.m_storage.m_data[uVar24] =
                   local_118.m_storage.m_data[uVar24] + local_108.m_storage.m_data[uVar24];
              uVar24 = uVar24 + 1;
            } while (local_108.m_storage.m_rows != uVar24);
          }
          local_f0.m_lhs = (LhsNested)&local_118;
          if (local_118.m_storage.m_rows == 0) {
            local_60 = 0.0;
          }
          else {
            if (local_118.m_storage.m_rows < 1) goto LAB_007d7170;
            local_b0.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_118.m_storage.m_data;
            local_60 = Eigen::internal::
                       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                       ::
                       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   *)&local_b0,(scalar_sum_op<double,_double> *)&local_199,
                                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                   *)&local_f0);
          }
          auVar28 = ZEXT1664(auVar32);
          (*sysd->_vptr_ChSystemDescriptor[0x19])(sysd,&local_108);
          (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&local_188,&local_108);
          if (local_88.m_storage.m_rows != local_188.m_storage.m_rows) goto LAB_007d713c;
          uVar24 = local_188.m_storage.m_rows + 7;
          if (-1 < local_188.m_storage.m_rows) {
            uVar24 = local_188.m_storage.m_rows;
          }
          uVar24 = uVar24 & 0xfffffffffffffff8;
          if (7 < local_188.m_storage.m_rows) {
            lVar25 = 0;
            do {
              auVar29 = vsubpd_avx512f(*(undefined1 (*) [64])(local_88.m_storage.m_data + lVar25),
                                       *(undefined1 (*) [64])(local_188.m_storage.m_data + lVar25));
              *(undefined1 (*) [64])(local_188.m_storage.m_data + lVar25) = auVar29;
              lVar25 = lVar25 + 8;
            } while (lVar25 < (long)uVar24);
          }
          if ((long)uVar24 < local_188.m_storage.m_rows) {
            do {
              local_188.m_storage.m_data[uVar24] =
                   local_88.m_storage.m_data[uVar24] - local_188.m_storage.m_data[uVar24];
              uVar24 = uVar24 + 1;
            } while (local_188.m_storage.m_rows != uVar24);
          }
          piVar1 = &(this->super_ChIterativeSolverVI).m_iterations;
          *piVar1 = *piVar1 + 1;
          local_f0.m_lhs = (LhsNested)&local_188;
          if (local_188.m_storage.m_rows == 0) {
            auVar32 = SUB6416(ZEXT864(0),0) << 0x40;
          }
          else {
            if (local_188.m_storage.m_rows < 1) goto LAB_007d7170;
            local_b0.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_188.m_storage.m_data;
            auVar28 = ZEXT1664(auVar28._0_16_);
            auVar29._0_8_ =
                 Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             *)&local_b0,(scalar_sum_op<double,_double> *)&local_199,
                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                             *)&local_f0);
            auVar29._8_56_ = extraout_var_00;
            auVar32 = auVar29._0_16_;
          }
          IVar14 = local_198.m_storage.m_rows;
          pdVar13 = local_198.m_storage.m_data;
          auVar32 = vsqrtsd_avx(auVar32,auVar32);
          local_168 = auVar32._0_8_;
          this->r_proj_resid = local_168;
          auVar32 = auVar28._0_16_;
          if (local_b8 <= local_168) {
            if (local_98.m_storage.m_rows != local_198.m_storage.m_rows) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_98,local_198.m_storage.m_rows,1);
            }
            IVar18 = local_d8.m_storage.m_rows;
            pdVar17 = local_d8.m_storage.m_data;
            IVar16 = local_188.m_storage.m_rows;
            pdVar15 = local_188.m_storage.m_data;
            if (local_98.m_storage.m_rows != IVar14) goto LAB_007d710b;
            uVar24 = local_98.m_storage.m_rows + 7;
            if (-1 < local_98.m_storage.m_rows) {
              uVar24 = local_98.m_storage.m_rows;
            }
            uVar24 = uVar24 & 0xfffffffffffffff8;
            if (7 < local_98.m_storage.m_rows) {
              lVar25 = 0;
              do {
                *(undefined1 (*) [64])(local_98.m_storage.m_data + lVar25) =
                     *(undefined1 (*) [64])(pdVar13 + lVar25);
                lVar25 = lVar25 + 8;
              } while (lVar25 < (long)uVar24);
            }
            if ((long)uVar24 < local_98.m_storage.m_rows) {
              do {
                local_98.m_storage.m_data[uVar24] = pdVar13[uVar24];
                uVar24 = uVar24 + 1;
              } while (local_98.m_storage.m_rows != uVar24);
            }
            if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond == true) {
              if (local_188.m_storage.m_rows != local_d8.m_storage.m_rows) goto LAB_007d721b;
              if (local_198.m_storage.m_rows != local_d8.m_storage.m_rows) {
                Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                          (&local_198,local_d8.m_storage.m_rows,1);
              }
              if (local_198.m_storage.m_rows != IVar18) goto LAB_007d71f9;
              uVar24 = local_198.m_storage.m_rows + 7;
              if (-1 < local_198.m_storage.m_rows) {
                uVar24 = local_198.m_storage.m_rows;
              }
              uVar24 = uVar24 & 0xfffffffffffffff8;
              if (7 < local_198.m_storage.m_rows) {
                lVar25 = 0;
                do {
                  auVar28 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar15 + lVar25),
                                           *(undefined1 (*) [64])(pdVar17 + lVar25));
                  *(undefined1 (*) [64])(local_198.m_storage.m_data + lVar25) = auVar28;
                  lVar25 = lVar25 + 8;
                } while (lVar25 < (long)uVar24);
              }
              if ((long)uVar24 < local_198.m_storage.m_rows) {
                do {
                  local_198.m_storage.m_data[uVar24] = pdVar15[uVar24] * pdVar17[uVar24];
                  uVar24 = uVar24 + 1;
                } while (local_198.m_storage.m_rows != uVar24);
              }
            }
            else {
              if (local_198.m_storage.m_rows != local_188.m_storage.m_rows) {
                Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                          (&local_198,local_188.m_storage.m_rows,1);
              }
              if (local_198.m_storage.m_rows != IVar16) goto LAB_007d710b;
              uVar24 = local_198.m_storage.m_rows + 7;
              if (-1 < local_198.m_storage.m_rows) {
                uVar24 = local_198.m_storage.m_rows;
              }
              uVar24 = uVar24 & 0xfffffffffffffff8;
              if (7 < local_198.m_storage.m_rows) {
                lVar25 = 0;
                do {
                  *(undefined1 (*) [64])(local_198.m_storage.m_data + lVar25) =
                       *(undefined1 (*) [64])(pdVar15 + lVar25);
                  lVar25 = lVar25 + 8;
                } while (lVar25 < (long)uVar24);
              }
              if ((long)uVar24 < local_198.m_storage.m_rows) {
                do {
                  local_198.m_storage.m_data[uVar24] = pdVar15[uVar24];
                  uVar24 = uVar24 + 1;
                } while (local_198.m_storage.m_rows != uVar24);
              }
            }
            IVar14 = local_148.m_storage.m_rows;
            pdVar13 = local_148.m_storage.m_data;
            if (local_c8.m_storage.m_rows != local_148.m_storage.m_rows) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_c8,local_148.m_storage.m_rows,1);
            }
            if (local_c8.m_storage.m_rows != IVar14) goto LAB_007d710b;
            uVar24 = local_c8.m_storage.m_rows + 7;
            if (-1 < local_c8.m_storage.m_rows) {
              uVar24 = local_c8.m_storage.m_rows;
            }
            uVar24 = uVar24 & 0xfffffffffffffff8;
            if (7 < local_c8.m_storage.m_rows) {
              lVar25 = 0;
              do {
                *(undefined1 (*) [64])(local_c8.m_storage.m_data + lVar25) =
                     *(undefined1 (*) [64])(pdVar13 + lVar25);
                lVar25 = lVar25 + 8;
              } while (lVar25 < (long)uVar24);
            }
            if ((long)uVar24 < local_c8.m_storage.m_rows) {
              do {
                local_c8.m_storage.m_data[uVar24] = pdVar13[uVar24];
                uVar24 = uVar24 + 1;
              } while (local_c8.m_storage.m_rows != uVar24);
            }
            auVar28 = ZEXT1664(auVar32);
            (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&local_148,&local_198);
            IVar14 = local_c8.m_storage.m_rows;
            pdVar15 = local_c8.m_storage.m_data;
            pdVar13 = local_148.m_storage.m_data;
            if (local_148.m_storage.m_rows != local_c8.m_storage.m_rows) goto LAB_007d713c;
            if (local_118.m_storage.m_rows != local_c8.m_storage.m_rows) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_118,local_c8.m_storage.m_rows,1);
            }
            if (local_118.m_storage.m_rows == IVar14) {
              uVar24 = local_118.m_storage.m_rows + 7;
              if (-1 < local_118.m_storage.m_rows) {
                uVar24 = local_118.m_storage.m_rows;
              }
              uVar24 = uVar24 & 0xfffffffffffffff8;
              if (7 < local_118.m_storage.m_rows) {
                lVar25 = 0;
                do {
                  auVar29 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar13 + lVar25),
                                           *(undefined1 (*) [64])(pdVar15 + lVar25));
                  *(undefined1 (*) [64])(local_118.m_storage.m_data + lVar25) = auVar29;
                  lVar25 = lVar25 + 8;
                } while (lVar25 < (long)uVar24);
              }
              if ((long)uVar24 < local_118.m_storage.m_rows) {
                do {
                  local_118.m_storage.m_data[uVar24] = pdVar13[uVar24] - pdVar15[uVar24];
                  uVar24 = uVar24 + 1;
                } while (local_118.m_storage.m_rows != uVar24);
              }
              if (local_198.m_storage.m_rows != local_118.m_storage.m_rows) goto LAB_007d70c7;
              local_f0.m_lhs = (LhsNested)&local_198;
              local_f0.m_rhs = (RhsNested)&local_118;
              if (local_118.m_storage.m_rows == 0) {
                local_78 = ZEXT816(0);
              }
              else {
                if (local_118.m_storage.m_rows < 1) goto LAB_007d7125;
                local_b0.
                super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                .
                super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
                m_d.data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                           (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                           local_198.m_storage.m_data;
                local_b0.
                super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                .
                super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
                m_d.data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                           (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                           local_118.m_storage.m_data;
                auVar28 = ZEXT1664(auVar28._0_16_);
                local_78._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                               (&local_b0,(scalar_sum_op<double,_double> *)&local_199,&local_f0);
                local_78._8_8_ = extraout_XMM0_Qb_00;
              }
              if (local_98.m_storage.m_rows != local_c8.m_storage.m_rows) {
LAB_007d70c7:
                __assert_fail("size() == other.size()","/usr/include/eigen3/Eigen/src/Core/Dot.h",
                              0x52,
                              "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Matrix<double, -1, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
                             );
              }
              local_f0.m_lhs = (LhsNested)&local_98;
              local_f0.m_rhs = (RhsNested)&local_c8;
              if (local_c8.m_storage.m_rows == 0) {
                local_58 = 0.0;
                uStack_50 = 0;
              }
              else {
                if (local_c8.m_storage.m_rows < 1) goto LAB_007d7125;
                local_b0.
                super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                .
                super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
                m_d.data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                           (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                           local_98.m_storage.m_data;
                local_b0.
                super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                .
                super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
                m_d.data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                           (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                           local_c8.m_storage.m_data;
                auVar28 = ZEXT1664(auVar28._0_16_);
                local_58 = Eigen::internal::
                           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                           ::
                           run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                     (&local_b0,(scalar_sum_op<double,_double> *)&local_199,
                                      &local_f0);
                uStack_50 = extraout_XMM0_Qb_01;
              }
              auVar12._8_8_ = uStack_40;
              auVar12._0_8_ = local_48;
              auVar32 = vandpd_avx(auVar12,local_78);
              if ((auVar32._0_8_ < 1e-29) ||
                 (auVar11._8_8_ = uStack_50, auVar11._0_8_ = local_58,
                 auVar32 = vandpd_avx(auVar12,auVar11), auVar32._0_8_ < 1e-29)) {
                local_128 = 0.0;
                uStack_120 = 0;
                if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose ==
                    true) {
                  auVar28 = ZEXT1664(auVar28._0_16_);
                  pCVar21 = GetLog();
                  pCVar22 = ChStreamOutAscii::operator<<
                                      (&pCVar21->super_ChStreamOutAscii,
                                       "Ribiere quotient beta restart: ");
                  pCVar22 = ChStreamOutAscii::operator<<(pCVar22,(double)local_78._0_8_);
                  pCVar22 = ChStreamOutAscii::operator<<(pCVar22," / ");
                  pCVar22 = ChStreamOutAscii::operator<<(pCVar22,local_58);
                  pCVar22 = ChStreamOutAscii::operator<<(pCVar22,"  iter=");
                  pCVar22 = ChStreamOutAscii::operator<<(pCVar22,iternum);
                  ChStreamOutAscii::operator<<(pCVar22,"\n");
                }
              }
              else {
                local_128 = (double)local_78._0_8_ / local_58;
                uStack_120 = local_78._8_8_;
              }
              if (local_178.m_storage.m_rows < 0) goto LAB_007d70e9;
              if (local_198.m_storage.m_rows == local_178.m_storage.m_rows) {
                uVar24 = local_178.m_storage.m_rows + 7;
                if (-1 < local_178.m_storage.m_rows) {
                  uVar24 = local_178.m_storage.m_rows;
                }
                uVar24 = uVar24 & 0xfffffffffffffff8;
                if (7 < local_178.m_storage.m_rows) {
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = local_128;
                  auVar29 = vbroadcastsd_avx512f(auVar4);
                  lVar25 = 0;
                  do {
                    auVar30 = vmulpd_avx512f(auVar29,*(undefined1 (*) [64])
                                                      (local_178.m_storage.m_data + lVar25));
                    auVar30 = vaddpd_avx512f(auVar30,*(undefined1 (*) [64])
                                                      (local_198.m_storage.m_data + lVar25));
                    *(undefined1 (*) [64])(local_178.m_storage.m_data + lVar25) = auVar30;
                    lVar25 = lVar25 + 8;
                  } while (lVar25 < (long)uVar24);
                }
                if ((long)uVar24 < local_178.m_storage.m_rows) {
                  do {
                    local_178.m_storage.m_data[uVar24] =
                         local_128 * local_178.m_storage.m_data[uVar24] +
                         local_198.m_storage.m_data[uVar24];
                    uVar24 = uVar24 + 1;
                  } while (local_178.m_storage.m_rows != uVar24);
                }
                if (local_158.m_storage.m_rows < 0) goto LAB_007d70e9;
                if (local_148.m_storage.m_rows == local_158.m_storage.m_rows) {
                  uVar24 = local_158.m_storage.m_rows + 7;
                  if (-1 < local_158.m_storage.m_rows) {
                    uVar24 = local_158.m_storage.m_rows;
                  }
                  uVar24 = uVar24 & 0xfffffffffffffff8;
                  if (7 < local_158.m_storage.m_rows) {
                    auVar5._8_8_ = 0;
                    auVar5._0_8_ = local_128;
                    auVar29 = vbroadcastsd_avx512f(auVar5);
                    lVar25 = 0;
                    do {
                      auVar30 = vmulpd_avx512f(auVar29,*(undefined1 (*) [64])
                                                        (local_158.m_storage.m_data + lVar25));
                      auVar30 = vaddpd_avx512f(auVar30,*(undefined1 (*) [64])
                                                        (local_148.m_storage.m_data + lVar25));
                      *(undefined1 (*) [64])(local_158.m_storage.m_data + lVar25) = auVar30;
                      lVar25 = lVar25 + 8;
                    } while (lVar25 < (long)uVar24);
                  }
                  if ((long)uVar24 < local_158.m_storage.m_rows) {
                    do {
                      local_158.m_storage.m_data[uVar24] =
                           local_128 * local_158.m_storage.m_data[uVar24] +
                           local_148.m_storage.m_data[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (local_158.m_storage.m_rows != uVar24);
                  }
                  if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = local_60;
                    auVar32 = vsqrtsd_avx(auVar28._0_16_,auVar6);
                    auVar28 = ZEXT1664(auVar28._0_16_);
                    ChIterativeSolverVI::AtIterationEnd
                              (&this->super_ChIterativeSolverVI,this->r_proj_resid,auVar32._0_8_,
                               iternum);
                  }
                  goto LAB_007d6efa;
                }
              }
              pcVar23 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
              ;
              goto LAB_007d7230;
            }
            pcVar23 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
            ;
            goto LAB_007d720e;
          }
          if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
            auVar28 = ZEXT1664(auVar32);
            pCVar21 = GetLog();
            pCVar22 = ChStreamOutAscii::operator<<
                                (&pCVar21->super_ChStreamOutAscii,"P(r)-converged! iter=");
            pCVar22 = ChStreamOutAscii::operator<<(pCVar22,iternum);
            pCVar22 = ChStreamOutAscii::operator<<(pCVar22," |P(r)|=");
            pCVar22 = ChStreamOutAscii::operator<<(pCVar22,this->r_proj_resid);
            ChStreamOutAscii::operator<<(pCVar22,"\n");
          }
LAB_007d6efa:
        } while ((local_b8 <= local_168) &&
                (iternum = iternum + 1,
                (int)iternum <
                (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations));
      }
      (*sysd->_vptr_ChSystemDescriptor[0x15])(sysd,&local_108);
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar21 = GetLog();
        pCVar22 = ChStreamOutAscii::operator<<(&pCVar21->super_ChStreamOutAscii,"residual: ");
        local_f0.m_lhs = (LhsNested)&local_188;
        if (local_188.m_storage.m_rows == 0) {
          auVar32 = ZEXT816(0) << 0x40;
        }
        else {
          if (local_188.m_storage.m_rows < 1) {
LAB_007d7170:
            pcVar23 = 
            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
            ;
LAB_007d7185:
            __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                          "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,pcVar23);
          }
          local_b0.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_188.m_storage.m_data;
          auVar30._0_8_ =
               Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
               ::
               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&local_b0,(scalar_sum_op<double,_double> *)&local_199,
                          (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           *)&local_f0);
          auVar30._8_56_ = extraout_var_01;
          auVar32 = auVar30._0_16_;
        }
        auVar32 = vsqrtsd_avx(auVar32,auVar32);
        pCVar22 = ChStreamOutAscii::operator<<(pCVar22,auVar32._0_8_);
        ChStreamOutAscii::operator<<(pCVar22," ---\n");
      }
      local_168 = this->r_proj_resid;
      if (local_d8.m_storage.m_data != (double *)0x0) {
        free((void *)local_d8.m_storage.m_data[-1]);
      }
      if (local_118.m_storage.m_data != (double *)0x0) {
        free((void *)local_118.m_storage.m_data[-1]);
      }
      if (local_c8.m_storage.m_data != (double *)0x0) {
        free((void *)local_c8.m_storage.m_data[-1]);
      }
      if (local_148.m_storage.m_data != (double *)0x0) {
        free((void *)local_148.m_storage.m_data[-1]);
      }
      if (local_138.m_storage.m_data != (double *)0x0) {
        free((void *)local_138.m_storage.m_data[-1]);
      }
      if (local_158.m_storage.m_data != (double *)0x0) {
        free((void *)local_158.m_storage.m_data[-1]);
      }
      if (local_98.m_storage.m_data != (double *)0x0) {
        free((void *)local_98.m_storage.m_data[-1]);
      }
      if (local_198.m_storage.m_data != (double *)0x0) {
        free((void *)local_198.m_storage.m_data[-1]);
      }
      if (local_188.m_storage.m_data != (double *)0x0) {
        free((void *)local_188.m_storage.m_data[-1]);
      }
      if (local_178.m_storage.m_data != (double *)0x0) {
        free((void *)local_178.m_storage.m_data[-1]);
      }
      if (local_88.m_storage.m_data != (double *)0x0) {
        free((void *)local_88.m_storage.m_data[-1]);
      }
      if (local_108.m_storage.m_data != (double *)0x0) {
        free((void *)local_108.m_storage.m_data[-1]);
      }
      return local_168;
    }
  }
  else {
    if (local_178.m_storage.m_rows != local_188.m_storage.m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&local_178,local_188.m_storage.m_rows,1);
    }
    if (local_178.m_storage.m_rows == IVar14) {
      uVar24 = local_178.m_storage.m_rows + 7;
      if (-1 < local_178.m_storage.m_rows) {
        uVar24 = local_178.m_storage.m_rows;
      }
      uVar24 = uVar24 & 0xfffffffffffffff8;
      if (7 < local_178.m_storage.m_rows) {
        lVar25 = 0;
        do {
          *(undefined1 (*) [64])(local_178.m_storage.m_data + lVar25) =
               *(undefined1 (*) [64])(pdVar13 + lVar25);
          lVar25 = lVar25 + 8;
        } while (lVar25 < (long)uVar24);
      }
      if ((long)uVar24 < local_178.m_storage.m_rows) {
        do {
          local_178.m_storage.m_data[uVar24] = pdVar13[uVar24];
          uVar24 = uVar24 + 1;
        } while (local_178.m_storage.m_rows != uVar24);
      }
      goto LAB_007d607f;
    }
  }
LAB_007d710b:
  pcVar23 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
  ;
LAB_007d720e:
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar23);
}

Assistant:

double ChSolverPMINRES::Solve_SupportingStiffness(ChSystemDescriptor& sysd) {
    m_iterations = 0;

    // Allocate auxiliary vectors;

    int nv = sysd.CountActiveVariables();
    int nc = sysd.CountActiveConstraints();
    int nx = nv + nc;  // total scalar unknowns, in x vector for full KKT system Z*x-d=0

    if (verbose)
        GetLog() << "\n-----Projected MINRES -supporting stiffness-, n.vars nx=" << nx
                 << "  max.iters=" << m_max_iterations << "\n";

    ChVectorDynamic<> mx(nx);
    ChVectorDynamic<> md(nx);
    ChVectorDynamic<> mp(nx);
    ChVectorDynamic<> mr(nx);
    ChVectorDynamic<> mz(nx);
    ChVectorDynamic<> mz_old(nx);
    ChVectorDynamic<> mZp(nx);
    ChVectorDynamic<> mMZp(nx);
    ChVectorDynamic<> mZMr(nx);
    ChVectorDynamic<> mZMr_old(nx);
    ChVectorDynamic<> mtmp(nx);
    ChVectorDynamic<> mDi(nx);

    //
    // --- Compute a diagonal (scaling) preconditioner for the KKT system:
    //

    // Initialize the mDi vector with the diagonal of the Z matrix
    sysd.BuildDiagonalVector(mDi);

    // Pre-invert the values, to avoid wasting time with divisions in the following.
    // From now, mDi contains the inverse of the diagonal of Z.
    // Note, for constraints, the diagonal is 0, so set inverse of D as 1 assuming
    // a constraint preconditioning and assuming the dot product of jacobians is already about 1.
    for (int nel = 0; nel < mDi.size(); nel++) {
        if (fabs(mDi(nel)) > 1e-9)
            mDi(nel) = 1.0 / mDi(nel);
        else
            mDi(nel) = 1.0;
    }

    //
    // --- Vector initialization and book-keeping
    //

    // Initialize the x vector of unknowns x ={q; -l} (if warm starting needed, initialize
    // x with current values of q and l in variables and constraints)
    if (m_warm_start)
        sysd.FromUnknownsToVector(mx);
    else
        mx.setZero();

    // Initialize the d vector filling it with {f, -b}
    sysd.BuildDiVector(md);

    //
    // --- THE P-MINRES ALGORITHM
    //

    double rel_tol = this->rel_tolerance;
    double abs_tol = m_tolerance;
    double rel_tol_d = md.lpNorm<Eigen::Infinity>() * rel_tol;

    // Initial projection of mx   ***TO DO***?
    sysd.UnknownsProject(mx);

    // r = d - Z*x;
    sysd.SystemProduct(mr, mx);  // r = Z*x
    mr = md - mr;                 // r =-Z*x+d

    if (m_use_precond)
        mp = mr.array() * mDi.array();
    else
        mp = mr;

    // z = Mi * r;
    mz = mp;

    // ZMr = Z*M*r = Z*z
    sysd.SystemProduct(mZMr, mz);  // ZMr = Z*z

    // Zp = Z*p
    sysd.SystemProduct(mZp, mp);  // Zp = Z*p

    //
    // THE LOOP
    //

    for (int iter = 0; iter < m_max_iterations; iter++) {
        // MZp = Mi*Zp; % = Mi*Z*p                  %% -- Precond
        if (m_use_precond)
            mMZp = mZp.array() * mDi.array();
        else
            mMZp = mZp;

        // alpha = (z'*(ZMr))/((MZp)'*(Zp));
        double zZMr = mz.dot(mZMr);    // zZMr = z'* ZMr
        double MZpZp = mMZp.dot(mZp);  // MZpZp = ((MZp)'*(Zp))

        // Robustness improver: case of division by zero
        if (fabs(MZpZp) < 10e-30) {
            if (verbose)
                GetLog() << "Rayleigh alpha denominator breakdown: " << zZMr << " / " << MZpZp << "=" << (zZMr / MZpZp)
                         << "  iter=" << iter << "\n";
            MZpZp = 10e-30;
        }

        // Robustness improver: case when r is orthogonal to Z*r (e.g. at first iteration, if f=0, x=0, with
        // constraints)
        if (fabs(zZMr) < 10e-30) {
            if (verbose)
                GetLog() << "Rayleigh alpha numerator breakdown: " << zZMr << " / " << MZpZp << "=" << (zZMr / MZpZp)
                         << "  iter=" << iter << "\n";
            zZMr = 1;
            MZpZp = 1;
        }

        double alpha = zZMr / MZpZp;  // 3)  alpha = (z'*(ZMr))/((MZp)'*(Zp));

        if (alpha < 0)
            if (verbose)
                GetLog() << "Rayleigh alpha < 0: " << alpha << "    iter=" << iter << "\n";

        // x = x + alpha * p;
        mtmp = alpha * mp;
        mx += mtmp;

        double maxdeltaunknowns = mtmp.norm();  //***better infinity norm for speed reasons?

        // x = Proj(x)
        sysd.UnknownsProject(mx);  // x = P(x)

        // r = d - Z*x;
        sysd.SystemProduct(mr, mx);  // r = Z*x
        mr = md - mr;                 // r =-Z*x+d

        m_iterations++;

        // Terminate iteration when the projected r is small, if (norm(r,2) <= max(rel_tol_d,abs_tol))
        r_proj_resid = mr.norm();
        if (r_proj_resid < ChMax(rel_tol_d, abs_tol)) {
            if (verbose)
                GetLog() << "P(r)-converged! iter=" << iter << " |P(r)|=" << r_proj_resid << "\n";
            break;
        }

        // z_old = z;
        mz_old = mz;

        // z = Mi*r;                                 %% -- Precond
        if (m_use_precond)
            mz = mr.array() * mDi.array();
        else
            mz = mr;

        // ZMr_old = ZMr;
        mZMr_old = mZMr;

        // ZMr = Z*z;
        sysd.SystemProduct(mZMr, mz);  // ZMr = Z*z

        // Ribiere quotient (for flexible preconditioning)
        //    beta = z'*(ZMr-ZMr_old)/(z_old'*(ZMr_old));
        mtmp = mZMr - mZMr_old;
        double numerator = mz.dot(mtmp);
        double denominator = mz_old.dot(mZMr_old);
        // Rayleigh quotient (original Minres)
        /// double numerator   = mr.MatrDot(mz,mZMr);			// 1)  r'* Z *r
        /// double denominator = mr.MatrDot(mz_old,mZMr_old);	// 2)  r_old'* Z *r_old
        double beta = numerator / denominator;

        // Robustness improver: restart if beta=0 or too large
        if (fabs(denominator) < 10e-30 || fabs(numerator) < 10e-30) {
            if (verbose)
                GetLog() << "Ribiere quotient beta restart: " << numerator << " / " << denominator << "  iter=" << iter
                         << "\n";
            beta = 0;
        }

        // p = z + beta * p;
        mp = mz + beta * mp;

        // Zp = ZMr + beta*Zp;   // Optimization!! avoid matr x vect!!! (if no 'p' projection has been done)
        mZp = mZMr + beta * mZp;

        // ---------------------------------------------
        // METRICS - convergence, plots, etc

        // For recording into correction/residuals/violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(r_proj_resid, maxdeltaunknowns, iter);
    }

    // After having solved for unknowns x={q;-l}, now copy those values from x vector to
    // the q values in ChVariable items and to l values in ChConstraint items
    sysd.FromVectorToUnknowns(mx);

    if (verbose)
        GetLog() << "residual: " << mr.norm() << " ---\n";

    return r_proj_resid;
}